

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::resend_request(upnp *this,error_code *ec)

{
  bool bVar1;
  reference prVar2;
  ulong uVar3;
  socklen_t in_ECX;
  sockaddr *__addr;
  rootdevice *dev;
  iterator __end1;
  iterator __begin1;
  set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
  *__range1;
  undefined4 local_2c;
  shared_ptr<libtorrent::upnp> me;
  error_code *ec_local;
  upnp *this_local;
  
  me.super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ec;
  bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
  if (!bVar1) {
    self((upnp *)&stack0xffffffffffffffd8);
    if ((this->m_closing & 1U) == 0) {
      if ((this->m_retry_count < 0xc) &&
         ((bVar1 = ::std::
                   set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                   ::empty(&this->m_devices), bVar1 || (this->m_retry_count < 4)))) {
        discover_device_impl(this);
        local_2c = 1;
      }
      else {
        bVar1 = ::std::
                set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                ::empty(&this->m_devices);
        if (bVar1) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    ((error_code *)&__range1,no_router,(type *)0x0);
          disable(this,(error_code *)&__range1);
          local_2c = 1;
        }
        else {
          __end1 = ::std::
                   set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                   ::begin(&this->m_devices);
          dev = (rootdevice *)
                ::std::
                set<libtorrent::upnp::rootdevice,_std::less<libtorrent::upnp::rootdevice>,_std::allocator<libtorrent::upnp::rootdevice>_>
                ::end(&this->m_devices);
          while (bVar1 = ::std::operator!=(&__end1,(_Self *)&dev), bVar1) {
            prVar2 = ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator*
                               (&__end1);
            uVar3 = ::std::__cxx11::string::empty();
            if ((((uVar3 & 1) != 0) &&
                (bVar1 = ::std::__shared_ptr::operator_cast_to_bool
                                   ((__shared_ptr *)&prVar2->upnp_connection), !bVar1)) &&
               ((prVar2->disabled & 1U) == 0)) {
              connect(this,(int)prVar2,__addr,in_ECX);
            }
            ::std::_Rb_tree_const_iterator<libtorrent::upnp::rootdevice>::operator++(&__end1);
          }
          local_2c = 0;
        }
      }
    }
    else {
      local_2c = 1;
    }
    ::std::shared_ptr<libtorrent::upnp>::~shared_ptr
              ((shared_ptr<libtorrent::upnp> *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void upnp::resend_request(error_code const& ec)
{
	TORRENT_ASSERT(is_single_thread());
	COMPLETE_ASYNC("upnp::resend_request");
	if (ec) return;

	std::shared_ptr<upnp> me(self());

	if (m_closing) return;

	if (m_retry_count < 12
		&& (m_devices.empty() || m_retry_count < 4))
	{
		discover_device_impl();
		return;
	}

	if (m_devices.empty())
	{
		disable(errors::no_router);
		return;
	}

	for (auto const& dev : m_devices)
	{
		if (!dev.control_url.empty()
			|| dev.upnp_connection
			|| dev.disabled)
		{
			continue;
		}

		// we don't have a WANIP or WANPPP url for this device,
		// ask for it
		connect(const_cast<rootdevice&>(dev));
	}
}